

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mapper004.cpp
# Opt level: O1

uint32_t __thiscall Mapper004::calcVBankOffset(Mapper004 *this,uint8_t idx)

{
  undefined3 in_register_00000031;
  
  return (CONCAT31(in_register_00000031,idx) & 0xffff) % ((uint)this->params->sizeChrRom << 3) << 10
  ;
}

Assistant:

uint32_t Mapper004::calcVBankOffset(uint8_t idx) {
    if (idx > 0x80) {
        idx -= 0x100;
    }
    idx %= ((params->sizeChrRom * 8192) / 0x0400);
    int32_t offset = idx * 0x0400;
    if (offset < 0) {
        offset += (params->sizeChrRom * 8192);
    }
    return uint32_t(offset);
}